

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

void wallet::coinselector_tests::waste_test_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_wrap_stringstream<char> *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  pointer local_b98;
  pointer local_b90;
  char *local_b88;
  char *local_b80;
  pointer local_b78;
  pointer local_b70;
  char *local_b68;
  char *local_b60;
  pointer local_b58;
  pointer local_b50;
  char *local_b48;
  char *local_b40;
  pointer local_b38;
  pointer local_b30;
  char *local_b28;
  char *local_b20;
  pointer local_b18;
  pointer local_b10;
  char *local_b08;
  char *local_b00;
  basic_wrap_stringstream<char> local_af8;
  waste_test t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b00 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"waste_test");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_b18 = (pbVar3->_M_dataplus)._M_p;
  local_b10 = local_b18 + pbVar3->_M_string_length;
  file.m_end = (iterator)0x36a;
  file.m_begin = (iterator)&local_b08;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_b18,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  waste_test::waste_test(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b20 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"waste_test");
  std::operator<<((ostream *)&local_af8,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b38 = (pbVar3->_M_dataplus)._M_p;
  local_b30 = local_b38 + pbVar3->_M_string_length;
  file_00.m_end = (iterator)0x36a;
  file_00.m_begin = (iterator)&local_b28;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_b38,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b40 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"waste_test");
  std::operator<<((ostream *)&local_af8,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b58 = (pbVar3->_M_dataplus)._M_p;
  local_b50 = local_b58 + pbVar3->_M_string_length;
  file_01.m_end = (iterator)0x36a;
  file_01.m_begin = (iterator)&local_b48;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_b58,msg_01);
  this = &local_af8;
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this);
  waste_test::test_method((waste_test *)this);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b60 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"waste_test");
  std::operator<<((ostream *)&local_af8,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b78 = (pbVar3->_M_dataplus)._M_p;
  local_b70 = local_b78 + pbVar3->_M_string_length;
  file_02.m_end = (iterator)0x36a;
  file_02.m_begin = (iterator)&local_b68;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_b78,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b80 = "";
  memset(&local_af8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_af8);
  std::operator<<((ostream *)&local_af8,'\"');
  std::operator<<((ostream *)&local_af8,"waste_test");
  std::operator<<((ostream *)&local_af8,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_af8);
  local_b98 = (pbVar3->_M_dataplus)._M_p;
  local_b90 = local_b98 + pbVar3->_M_string_length;
  file_03.m_end = (iterator)0x36a;
  file_03.m_begin = (iterator)&local_b88;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_b98,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_af8);
  WalletTestingSetup::~WalletTestingSetup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(waste_test)
{
    const CAmount fee{100};
    const CAmount min_viable_change{300};
    const CAmount change_cost{125};
    const CAmount change_fee{30};
    const CAmount fee_diff{40};
    const CAmount in_amt{3 * COIN};
    const CAmount target{2 * COIN};
    const CAmount excess{80};
    const CAmount exact_target{in_amt - fee * 2}; // Maximum spendable amount after fees: no change, no excess

    // In the following, we test that the waste is calculated correctly in various scenarios.
    // Usually, RecalculateWaste would compute change_fee and change_cost on basis of the
    // change output type, current feerate, and discard_feerate, but we use fixed values
    // across this test to make the test easier to understand.
    {
        // Waste with change is the change cost and difference between fee and long term fee
        SelectionResult selection1{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection1, /*fee=*/fee, /*long_term_fee=*/fee - fee_diff);
        add_coin(2 * COIN, 2, selection1, fee, fee - fee_diff);
        selection1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + change_cost, selection1.GetWaste());

        // Waste will be greater when fee is greater, but long term fee is the same
        SelectionResult selection2{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection2, fee * 2, fee - fee_diff);
        add_coin(2 * COIN, 2, selection2, fee * 2, fee - fee_diff);
        selection2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_GT(selection2.GetWaste(), selection1.GetWaste());

        // Waste with change is the change cost and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection3{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection3, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection3, fee, fee + fee_diff);
        selection3.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + change_cost, selection3.GetWaste());
        BOOST_CHECK_LT(selection3.GetWaste(), selection1.GetWaste());
    }

    {
        // Waste without change is the excess and difference between fee and long term fee
        SelectionResult selection_nochange1{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange1, fee, fee - fee_diff);
        add_coin(2 * COIN, 2, selection_nochange1, fee, fee - fee_diff);
        selection_nochange1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + excess, selection_nochange1.GetWaste());

        // Waste without change is the excess and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection_nochange2{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange2, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection_nochange2, fee, fee + fee_diff);
        selection_nochange2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + excess, selection_nochange2.GetWaste());
        BOOST_CHECK_LT(selection_nochange2.GetWaste(), selection_nochange1.GetWaste());
    }

    {
        // Waste with change and fee == long term fee is just cost of change
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(change_cost, selection.GetWaste());
    }

    {
        // Waste without change and fee == long term fee is just the excess
        SelectionResult selection{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(excess, selection.GetWaste());
    }

    {
        // Waste is 0 when fee == long_term_fee, no change, and no excess
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost , change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-cost_of_change), and no excess
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, /*change_cost=*/fee_diff * 2, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-excess), no change cost
        const CAmount new_target{exact_target - /*excess=*/fee_diff * 2};
        SelectionResult selection{new_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and the selected value == target
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        const CAmount target_waste1{-2 * fee_diff}; // = (2 * fee) - (2 * (fee + fee_diff))
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste1, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and change_cost < - (inputs * (fee - long_term_fee))
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        const CAmount large_fee_diff{90};
        const CAmount target_waste2{-2 * large_fee_diff + change_cost};
        // = (2 * fee) - (2 * (fee + large_fee_diff)) + change_cost
        // = (2 * 100) - (2 * (100 + 90)) + 125
        // = 200 - 380 + 125 = -55
        assert(target_waste2 == -55);
        add_coin(1 * COIN, 1, selection, fee, fee + large_fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + large_fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste2, selection.GetWaste());
    }
}